

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::FtraceConfig::ParseFromArray(FtraceConfig *this,void *raw,size_t size)

{
  byte bVar1;
  _Head_base<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_false> _Var2;
  bool bVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  pointer pbVar9;
  uint8_t cur_byte_2;
  ulong uVar10;
  uint8_t cur_byte_3;
  ulong *puVar11;
  uint8_t cur_byte;
  ulong uVar12;
  uint8_t cur_byte_1;
  ulong *puVar13;
  Field local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = &this->ftrace_events_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->ftrace_events_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_40 = &this->atrace_categories_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_40,(this->atrace_categories_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->atrace_apps_,
                    (this->atrace_apps_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->unknown_fields_)._M_string_length = 0;
  local_48 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar8 = (ulong *)(size + (long)raw);
  do {
    if (puVar8 <= raw) goto switchD_0022fedf_caseD_3;
    bVar1 = (byte)*raw;
    uVar7 = (ulong)bVar1;
    puVar11 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar7 = (ulong)(bVar1 & 0x7f);
      lVar6 = 7;
      do {
        if ((puVar8 <= puVar11) || (0x38 < lVar6 - 7U)) goto switchD_0022fedf_caseD_3;
        uVar5 = *puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar7 = uVar7 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
        lVar6 = lVar6 + 7;
      } while ((char)(byte)uVar5 < '\0');
    }
    uVar5 = uVar7 >> 3;
    if (((uint)uVar5 == 0) || (puVar8 <= puVar11)) goto switchD_0022fedf_caseD_3;
    switch((uint)uVar7 & 7) {
    case 0:
      uVar10 = 0;
      uVar12 = 0;
      while( true ) {
        puVar13 = (ulong *)((long)puVar11 + 1);
        uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
        if (-1 < (char)(byte)*puVar11) break;
        if ((puVar8 <= puVar13) ||
           (bVar3 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar3))
        goto switchD_0022fedf_caseD_3;
      }
      local_58.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 1:
      puVar13 = puVar11 + 1;
      if (puVar8 < puVar13) goto switchD_0022fedf_caseD_3;
      uVar10 = *puVar11;
      local_58.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 2:
      puVar11 = (ulong *)((long)puVar11 + 1);
      uVar12 = 0;
      uVar10 = 0;
      puVar13 = puVar11;
      while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                      uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
        if (puVar8 <= puVar13) goto switchD_0022fedf_caseD_3;
        puVar13 = (ulong *)((long)puVar13 + 1);
        puVar11 = (ulong *)((long)puVar11 + 1);
        bVar3 = 0x38 < uVar10;
        uVar10 = uVar10 + 7;
        if (bVar3) goto switchD_0022fedf_caseD_3;
      }
      if (uVar12 <= (ulong)((long)puVar8 - (long)puVar11)) {
        local_58.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
        puVar13 = (ulong *)((long)puVar13 + uVar12);
        uVar10 = (ulong)puVar11 & 0xffffffff;
        goto LAB_0022ffbb;
      }
    default:
      goto switchD_0022fedf_caseD_3;
    case 5:
      puVar13 = (ulong *)((long)puVar11 + 4);
      if (puVar8 < puVar13) goto switchD_0022fedf_caseD_3;
      uVar10 = (ulong)(uint)*puVar11;
      local_58.int_value_ = 0;
    }
    uVar12 = 0;
LAB_0022ffbb:
    raw = puVar13;
  } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar12));
  local_58.int_value_ = local_58.int_value_ | uVar10 & 0xffffffff;
  uVar10 = uVar5 << 0x20 | uVar12;
  uVar7 = uVar10 | (ulong)((uint)uVar7 & 7) << 0x30;
  local_58.size_ = (uint32_t)uVar12;
  local_58.type_ = (uint8_t)(uVar7 >> 0x30);
  local_58.id_ = (uint16_t)(uVar10 >> 0x20);
  sVar4 = (short)uVar5;
  do {
    if (sVar4 == 0) {
switchD_0022fedf_caseD_3:
      return puVar8 == (ulong *)raw;
    }
    if ((ushort)uVar5 < 0x11) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar5 & 0x3f);
    }
    switch((uint)uVar5 & 0xffff) {
    case 1:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_38);
      pbVar9 = (this->ftrace_events_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_002300f9;
    case 2:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_40);
      pbVar9 = (this->atrace_categories_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_002300f9;
    case 3:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&this->atrace_apps_);
      pbVar9 = (this->atrace_apps_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
LAB_002300f9:
      protozero::Field::get(&local_58,pbVar9 + -1);
      break;
    default:
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,local_48);
      break;
    case 10:
      this->buffer_size_kb_ = (uint32_t)local_58.int_value_;
      break;
    case 0xb:
      this->drain_period_ms_ = (uint32_t)local_58.int_value_;
      break;
    case 0xc:
      _Var2._M_head_impl =
           (this->compact_sched_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::FtraceConfig_CompactSchedConfig,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_std::default_delete<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>_>
           .super__Head_base<0UL,_perfetto::protos::gen::FtraceConfig_CompactSchedConfig_*,_false>.
           _M_head_impl;
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 0x20))
                (_Var2._M_head_impl,local_58.int_value_,uVar7 & 0xffffffff);
      break;
    case 0xd:
      this->symbolize_ksyms_ = local_58.int_value_ != 0;
      break;
    case 0xe:
      this->initialize_ksyms_synchronously_for_testing_ = local_58.int_value_ != 0;
      break;
    case 0xf:
      this->throttle_rss_stat_ = local_58.int_value_ != 0;
      break;
    case 0x10:
      this->disable_generic_events_ = local_58.int_value_ != 0;
    }
    do {
      if (puVar8 <= raw) goto switchD_0022fedf_caseD_3;
      bVar1 = (byte)*raw;
      uVar7 = (ulong)(uint)bVar1;
      puVar11 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = (ulong)(bVar1 & 0x7f);
        lVar6 = 7;
        do {
          if ((puVar8 <= puVar11) || (0x38 < lVar6 - 7U)) goto switchD_0022fedf_caseD_3;
          uVar5 = *puVar11;
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar7 = uVar7 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
          lVar6 = lVar6 + 7;
        } while ((char)(byte)uVar5 < '\0');
      }
      uVar5 = uVar7 >> 3;
      if (((uint)uVar5 == 0) || (puVar8 <= puVar11)) goto switchD_0022fedf_caseD_3;
      switch((uint)uVar7 & 7) {
      case 0:
        uVar10 = 0;
        uVar12 = 0;
        while( true ) {
          puVar13 = (ulong *)((long)puVar11 + 1);
          uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
          if (-1 < (char)(byte)*puVar11) break;
          if ((puVar8 <= puVar13) ||
             (bVar3 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar3))
          goto switchD_0022fedf_caseD_3;
        }
        local_58.int_value_ = uVar10 & 0xffffffff00000000;
        break;
      case 1:
        puVar13 = puVar11 + 1;
        if (puVar8 < puVar13) goto switchD_0022fedf_caseD_3;
        uVar10 = *puVar11;
        local_58.int_value_ = uVar10 & 0xffffffff00000000;
        break;
      case 2:
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar12 = 0;
        uVar10 = 0;
        puVar13 = puVar11;
        while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                        uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
          if (puVar8 <= puVar13) goto switchD_0022fedf_caseD_3;
          puVar13 = (ulong *)((long)puVar13 + 1);
          puVar11 = (ulong *)((long)puVar11 + 1);
          bVar3 = 0x38 < uVar10;
          uVar10 = uVar10 + 7;
          if (bVar3) goto switchD_0022fedf_caseD_3;
        }
        if (uVar12 <= (ulong)((long)puVar8 - (long)puVar11)) {
          local_58.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
          puVar13 = (ulong *)((long)puVar13 + uVar12);
          uVar10 = (ulong)puVar11 & 0xffffffff;
          goto LAB_002302e5;
        }
      default:
        goto switchD_0022fedf_caseD_3;
      case 5:
        puVar13 = (ulong *)((long)puVar11 + 4);
        if (puVar8 < puVar13) goto switchD_0022fedf_caseD_3;
        uVar10 = (ulong)(uint)*puVar11;
        local_58.int_value_ = 0;
      }
      uVar12 = 0;
LAB_002302e5:
      raw = puVar13;
    } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar12));
    local_58.int_value_ = local_58.int_value_ | uVar10 & 0xffffffff;
    uVar10 = uVar5 << 0x20 | uVar12;
    uVar7 = uVar10 | (uVar7 & 7) << 0x30;
    local_58.size_ = (uint32_t)uVar12;
    local_58.type_ = (uint8_t)(uVar7 >> 0x30);
    local_58.id_ = (uint16_t)(uVar10 >> 0x20);
    sVar4 = (short)uVar5;
  } while( true );
}

Assistant:

bool FtraceConfig::ParseFromArray(const void* raw, size_t size) {
  ftrace_events_.clear();
  atrace_categories_.clear();
  atrace_apps_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* ftrace_events */:
        ftrace_events_.emplace_back();
        field.get(&ftrace_events_.back());
        break;
      case 2 /* atrace_categories */:
        atrace_categories_.emplace_back();
        field.get(&atrace_categories_.back());
        break;
      case 3 /* atrace_apps */:
        atrace_apps_.emplace_back();
        field.get(&atrace_apps_.back());
        break;
      case 10 /* buffer_size_kb */:
        field.get(&buffer_size_kb_);
        break;
      case 11 /* drain_period_ms */:
        field.get(&drain_period_ms_);
        break;
      case 12 /* compact_sched */:
        (*compact_sched_).ParseFromArray(field.data(), field.size());
        break;
      case 13 /* symbolize_ksyms */:
        field.get(&symbolize_ksyms_);
        break;
      case 14 /* initialize_ksyms_synchronously_for_testing */:
        field.get(&initialize_ksyms_synchronously_for_testing_);
        break;
      case 15 /* throttle_rss_stat */:
        field.get(&throttle_rss_stat_);
        break;
      case 16 /* disable_generic_events */:
        field.get(&disable_generic_events_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}